

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O0

void __thiscall DListMenu::Drawer(DListMenu *this)

{
  int iVar1;
  uint uVar2;
  FListMenuItem **ppFVar3;
  uint local_14;
  uint i;
  DListMenu *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar2 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                      (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>);
    if (uVar2 <= local_14) break;
    ppFVar3 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                        (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                         (ulong)local_14);
    if (((*ppFVar3)->mEnabled & 1U) != 0) {
      ppFVar3 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                          (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                           (ulong)local_14);
      (*(*ppFVar3)->_vptr_FListMenuItem[4])
                (*ppFVar3,(ulong)(this->mDesc->mSelectedItem == local_14));
    }
    local_14 = local_14 + 1;
  }
  if (-1 < this->mDesc->mSelectedItem) {
    iVar1 = this->mDesc->mSelectedItem;
    uVar2 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                      (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>);
    if (iVar1 < (int)uVar2) {
      ppFVar3 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                          (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                           (long)this->mDesc->mSelectedItem);
      FListMenuItem::DrawSelector
                (*ppFVar3,this->mDesc->mSelectOfsX,this->mDesc->mSelectOfsY,
                 (FTextureID)(this->mDesc->mSelector).texnum);
    }
  }
  DMenu::Drawer(&this->super_DMenu);
  return;
}

Assistant:

void DListMenu::Drawer ()
{
	for(unsigned i=0;i<mDesc->mItems.Size(); i++)
	{
		if (mDesc->mItems[i]->mEnabled) mDesc->mItems[i]->Drawer(mDesc->mSelectedItem == (int)i);
	}
	if (mDesc->mSelectedItem >= 0 && mDesc->mSelectedItem < (int)mDesc->mItems.Size())
		mDesc->mItems[mDesc->mSelectedItem]->DrawSelector(mDesc->mSelectOfsX, mDesc->mSelectOfsY, mDesc->mSelector);
	Super::Drawer();
}